

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::add_escaped_characters(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  pointer pcVar2;
  void *pvVar3;
  void *pvVar4;
  char __c;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,str->_M_string_length + 4);
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      pvVar3 = escapedChars_abi_cxx11_;
      __c = pcVar2[sVar5];
      if (DAT_0056c340 != 0) {
        pvVar4 = memchr(escapedChars_abi_cxx11_,(int)__c,DAT_0056c340);
        if ((long)pvVar4 - (long)pvVar3 != -1 && pvVar4 != (void *)0x0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\\');
          __c = *(char *)(escapedCharsCode_abi_cxx11_ + ((long)pvVar4 - (long)pvVar3));
        }
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,__c);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}